

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O0

vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> * __thiscall
mxx::allgatherv<std::pair<int,int>>
          (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
           *__return_storage_ptr__,mxx *this,pair<int,_int> *data,size_t size,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *recv_sizes,comm *comm)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *size_00;
  size_t data_00;
  unsigned_long __n;
  reference out;
  allocator<std::pair<int,_int>_> local_4a;
  undefined1 local_49;
  unsigned_long *local_48;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_40;
  unsigned_long local_38;
  size_t total_size;
  comm *comm_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *recv_sizes_local;
  size_t size_local;
  pair<int,_int> *data_local;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *result;
  
  total_size = (size_t)recv_sizes;
  comm_local = (comm *)size;
  recv_sizes_local = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)data;
  size_local = (size_t)this;
  data_local = (pair<int,_int> *)__return_storage_ptr__;
  local_40._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)size);
  local_48 = (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)comm_local);
  __n = std::
        accumulate<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
                  (local_40,(__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                             )local_48,0);
  local_49 = 0;
  local_38 = __n;
  std::allocator<std::pair<int,_int>_>::allocator(&local_4a);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            (__return_storage_ptr__,__n,&local_4a);
  std::allocator<std::pair<int,_int>_>::~allocator(&local_4a);
  data_00 = size_local;
  size_00 = recv_sizes_local;
  out = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                  (__return_storage_ptr__,0);
  allgatherv<std::pair<int,int>>
            ((pair<int,_int> *)data_00,(size_t)size_00,out,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)comm_local,(comm *)total_size)
  ;
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> allgatherv(const T* data, size_t size, const std::vector<size_t>& recv_sizes, const mxx::comm& comm = mxx::comm()) {
    size_t total_size = std::accumulate(recv_sizes.begin(), recv_sizes.end(), static_cast<size_t>(0));
    std::vector<T> result(total_size);
    allgatherv(data, size, &result[0], recv_sizes, comm);
    return result;
}